

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O0

add_torrent_params * __thiscall
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
          error_code *ec)

{
  bool bVar1;
  span<const_char> buffer_00;
  int in_stack_ffffffffffffff40;
  storage_constructor_type *sc;
  storage_constructor_type local_98;
  libtorrent *local_78;
  char *local_70;
  undefined1 local_68 [8];
  bdecode_node rd;
  error_code *ec_local;
  span<const_char> buffer_local;
  
  rd._56_8_ = buffer.m_len;
  buffer_local.m_ptr = buffer.m_ptr;
  ec_local = (error_code *)this;
  buffer_local.m_len = (difference_type)__return_storage_ptr__;
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_78,(span<const_char> *)&ec_local);
  buffer_00.m_len = rd._56_8_;
  buffer_00.m_ptr = local_70;
  bdecode((bdecode_node *)local_68,local_78,buffer_00,(error_code *)0x0,(int *)0x64,2000000,
          in_stack_ffffffffffffff40);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)rd._56_8_);
  if (bVar1) {
    sc = &local_98;
    std::
    function<libtorrent::storage_interface*(libtorrent::storage_params_const&,libtorrent::file_pool&)>
    ::
    function<libtorrent::storage_interface*(&)(libtorrent::storage_params_const&,libtorrent::file_pool&),void>
              ((function<libtorrent::storage_interface*(libtorrent::storage_params_const&,libtorrent::file_pool&)>
                *)sc,default_storage_constructor);
    add_torrent_params::add_torrent_params(__return_storage_ptr__,sc);
    std::
    function<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>
    ::~function(&local_98);
  }
  else {
    read_resume_data(__return_storage_ptr__,(bdecode_node *)local_68,(error_code *)rd._56_8_);
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_68);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(span<char const> buffer, error_code& ec)
	{
		bdecode_node rd = bdecode(buffer, ec);
		if (ec) return add_torrent_params();

		return read_resume_data(rd, ec);
	}